

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

Float __thiscall
pbrt::InvertCatmullRom(pbrt *this,span<const_float> x,span<const_float> values,Float u)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  ulong uVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_ZMM19 [64];
  undefined1 auVar30 [16];
  
  auVar26._4_60_ = in_register_00001204;
  auVar26._0_4_ = u;
  pfVar14 = (float *)x.n;
  if (u <= *pfVar14) {
    return *(Float *)this;
  }
  if (pfVar14[(long)values.ptr + -1] <= u) {
    return *(Float *)(this + (long)x.ptr * 4 + -4);
  }
  uVar13 = (long)values.ptr - 2;
  lVar11 = 1;
  uVar15 = uVar13;
  while (uVar10 = uVar15, 0 < (long)uVar10) {
    uVar15 = uVar10 >> 1;
    if (pfVar14[(int)uVar15 + (int)lVar11] <= u) {
      lVar11 = uVar15 + 1 + lVar11;
      uVar15 = ~uVar15 + uVar10;
    }
  }
  if (lVar11 - 1U < uVar13) {
    uVar13 = lVar11 - 1U;
  }
  uVar15 = 0;
  if (0 < lVar11) {
    uVar15 = uVar13;
  }
  iVar16 = (int)uVar15;
  fVar1 = *(float *)(this + (long)iVar16 * 4);
  lVar11 = (long)((uVar15 << 0x20) + 0x100000000) >> 0x1e;
  fVar2 = pfVar14[iVar16];
  fVar3 = *(float *)((long)pfVar14 + lVar11);
  fVar4 = *(float *)(this + lVar11) - fVar1;
  if (iVar16 < 1) {
    fVar29 = fVar3 - fVar2;
  }
  else {
    fVar29 = (fVar4 * (fVar3 - pfVar14[iVar16 - 1])) /
             (*(float *)(this + lVar11) - *(float *)(this + (ulong)(iVar16 - 1) * 4));
  }
  auVar30 = ZEXT416((uint)fVar29);
  pfVar12 = (float *)((long)((uVar15 << 0x20) + 0x200000000) >> 0x20);
  if (pfVar12 < x.ptr) {
    auVar31._0_4_ =
         (fVar4 * (pfVar14[(long)pfVar12] - fVar2)) / (*(float *)(this + (long)pfVar12 * 4) - fVar1)
    ;
    auVar31._4_12_ = SUB6012((undefined1  [60])0x0,0);
  }
  else {
    auVar31 = ZEXT416((uint)(fVar3 - fVar2));
  }
  auVar19 = ZEXT816(0) << 0x40;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * 0.0 + fVar2)),auVar30,auVar19);
  auVar17 = vfmadd231ss_fma(auVar17,auVar31,auVar19);
  fVar29 = auVar17._0_4_ - u;
  auVar17._8_4_ = 0x7fffffff;
  auVar17._0_8_ = 0x7fffffff7fffffff;
  auVar17._12_4_ = 0x7fffffff;
  auVar17 = vandps_avx512vl(ZEXT416((uint)fVar29),auVar17);
  if (1e-06 <= auVar17._0_4_) {
    auVar27 = ZEXT416((uint)fVar2);
    auVar28 = ZEXT416((uint)fVar3);
    auVar17 = vfmadd213ss_fma(ZEXT816(0) << 0x20,auVar27,auVar28);
    auVar17 = vfmadd231ss_fma(auVar17,auVar30,auVar19);
    auVar17 = vfmadd231ss_fma(auVar17,auVar31,auVar19);
    fVar2 = auVar17._0_4_ - u;
    auVar19._8_4_ = 0x7fffffff;
    auVar19._0_8_ = 0x7fffffff7fffffff;
    auVar19._12_4_ = 0x7fffffff;
    auVar17 = vandps_avx512vl(ZEXT416((uint)fVar2),auVar19);
    if (1e-06 <= auVar17._0_4_) {
      auVar17 = ZEXT416((uint)(fVar29 / (fVar2 - fVar29)));
      auVar32 = ZEXT1664(auVar17);
      auVar33 = ZEXT816(0);
      auVar17 = vsubss_avx512f(auVar33,auVar17);
      uVar5 = vcmpps_avx512vl(ZEXT416((uint)fVar29),auVar33,1);
      auVar35._8_4_ = 0x7fffffff;
      auVar35._0_8_ = 0x7fffffff7fffffff;
      auVar35._12_4_ = 0x7fffffff;
      auVar34 = SUB6416(ZEXT464(0x3f800000),0);
      auVar18 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
      auVar23 = auVar34;
      do {
        auVar19 = vaddss_avx512f(auVar23,auVar18);
        auVar19 = vmulss_avx512f(auVar19,SUB6416(ZEXT464(0x3f000000),0));
        uVar6 = vcmpss_avx512f(auVar17,auVar23,1);
        bVar7 = (bool)((byte)uVar6 & 1);
        auVar20._4_12_ = auVar19._4_12_;
        uVar6 = vcmpss_avx512f(auVar18,auVar17,1);
        bVar8 = (bool)((byte)uVar6 & 1);
        auVar20._0_4_ =
             (uint)bVar8 * ((uint)bVar7 * auVar17._0_4_ + (uint)!bVar7 * auVar19._0_4_) +
             (uint)!bVar8 * auVar19._0_4_;
        auVar17 = vmulss_avx512f(auVar20,auVar20);
        auVar19 = vmulss_avx512f(auVar20,auVar17);
        auVar24 = SUB6416(ZEXT464(0x40400000),0);
        auVar21 = vmulss_avx512f(auVar17,auVar24);
        auVar25 = SUB6416(ZEXT464(0xc0000000),0);
        auVar22 = vfmadd213ss_avx512f(auVar25,auVar19,auVar21);
        auVar21 = vfmsub231ss_avx512f(auVar21,auVar19,SUB6416(ZEXT464(0x40000000),0));
        auVar21 = vaddss_avx512f(auVar21,auVar34);
        auVar22 = vmulss_avx512f(auVar28,auVar22);
        auVar21 = vfmadd231ss_avx512f(auVar22,auVar27,auVar21);
        auVar22 = vfmadd213ss_avx512f(auVar25,auVar17,auVar19);
        auVar22 = vaddss_avx512f(auVar20,auVar22);
        auVar21 = vfmadd213ss_avx512f(auVar22,auVar30,auVar21);
        auVar19 = vsubss_avx512f(auVar19,auVar17);
        auVar19 = vfmadd213ss_avx512f(auVar19,auVar31,auVar21);
        auVar19 = vsubss_avx512f(auVar19,auVar26._0_16_);
        uVar6 = vcmpps_avx512vl(auVar19,auVar33,5);
        bVar9 = (byte)uVar5 ^ (byte)uVar6;
        auVar23._0_4_ = (uint)(bVar9 & 1) * auVar23._0_4_ + (uint)!(bool)(bVar9 & 1) * auVar20._0_4_
        ;
        auVar23._4_12_ = auVar20._4_12_;
        auVar18._0_4_ = (uint)(bVar9 & 1) * auVar20._0_4_ + (uint)!(bool)(bVar9 & 1) * auVar18._0_4_
        ;
        auVar21 = vsubss_avx512f(auVar23,auVar18);
        auVar22 = vandps_avx512vl(auVar19,auVar35);
        uVar13 = vcmpps_avx512vl(auVar22,SUB6416(ZEXT464(0x358637bd),0),5);
        uVar15 = vcmpps_avx512vl(auVar21,SUB6416(ZEXT464(0x358637bd),0),5);
        if ((uVar13 & uVar15 & 1) == 0) {
          auVar32 = ZEXT1664(auVar20);
          auVar17 = auVar20;
        }
        else {
          auVar21 = vmulss_avx512f(auVar20,auVar25);
          auVar21 = vfmadd231ss_avx512f(auVar21,auVar17,auVar24);
          auVar22 = vmulss_avx512f(auVar20,ZEXT416(0xc0800000));
          auVar22 = vfmadd231ss_avx512f(auVar22,auVar17,auVar24);
          auVar22 = vaddss_avx512f(auVar22,auVar34);
          auVar24 = vmulss_avx512f(auVar20,ZEXT416(0x40c00000));
          auVar25 = vfmsub213ss_avx512f(ZEXT416(0x40c00000),auVar17,auVar24);
          auVar17 = vfmadd231ss_avx512f(auVar24,auVar17,ZEXT416(0xc0c00000));
          auVar17 = vmulss_avx512f(auVar28,auVar17);
          auVar17 = vfmadd231ss_avx512f(auVar17,auVar27,auVar25);
          auVar17 = vfmadd231ss_avx512f(auVar17,auVar30,auVar22);
          auVar17 = vfmadd231ss_avx512f(auVar17,auVar31,auVar21);
          auVar17 = vdivss_avx512f(auVar19,auVar17);
          auVar17 = vsubss_avx512f(auVar20,auVar17);
        }
        auVar19 = auVar32._0_16_;
      } while ((uVar13 & uVar15 & 1) != 0);
    }
    else {
      auVar19 = SUB6416(ZEXT464(0x3f800000),0);
    }
  }
  auVar30 = vfmadd213ss_fma(ZEXT416((uint)fVar4),auVar19,ZEXT416((uint)fVar1));
  return auVar30._0_4_;
}

Assistant:

Float InvertCatmullRom(pstd::span<const Float> x, pstd::span<const Float> values,
                       Float u) {
    // Stop when _u_ is out of bounds
    if (!(u > values.front()))
        return x.front();
    else if (!(u < values.back()))
        return x.back();

    // Map _u_ to a spline interval by inverting _values_
    int i = FindInterval(values.size(), [&](int i) { return values[i] <= u; });

    // Look up $x_i$ and function values of spline segment _i_
    Float x0 = x[i], x1 = x[i + 1];
    Float f0 = values[i], f1 = values[i + 1];
    Float width = x1 - x0;

    // Approximate derivatives using finite differences
    Float d0, d1;
    if (i > 0)
        d0 = width * (f1 - values[i - 1]) / (x1 - x[i - 1]);
    else
        d0 = f1 - f0;
    if (i + 2 < x.size())
        d1 = width * (values[i + 2] - f0) / (x[i + 2] - x0);
    else
        d1 = f1 - f0;

    auto eval = [&](Float t) -> std::pair<Float, Float> {
        // Compute powers of _t_
        Float t2 = t * t, t3 = t2 * t;

        // Set _Fhat_ using Equation (8.27)
        Float Fhat = (2 * t3 - 3 * t2 + 1) * f0 + (-2 * t3 + 3 * t2) * f1 +
                     (t3 - 2 * t2 + t) * d0 + (t3 - t2) * d1;
        // Set _fhat_ using Equation (not present)
        Float fhat = (6 * t2 - 6 * t) * f0 + (-6 * t2 + 6 * t) * f1 +
                     (3 * t2 - 4 * t + 1) * d0 + (3 * t2 - 2 * t) * d1;
        return {Fhat - u, fhat};
    };
    Float t = NewtonBisection(0, 1, eval);

    return x0 + t * width;
}